

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O2

void bson_iter_document(bson_iter_t *iter,uint32_t *document_len,uint8_t **document)

{
  undefined8 uVar1;
  char *pcVar2;
  
  if (iter == (bson_iter_t *)0x0) {
    pcVar2 = "iter";
    uVar1 = 0x6d4;
  }
  else if (document_len == (uint32_t *)0x0) {
    pcVar2 = "document_len";
    uVar1 = 0x6d5;
  }
  else {
    if (document != (uint8_t **)0x0) {
      *document = (uint8_t *)0x0;
      *document_len = 0;
      if (iter->raw[iter->type] == '\x03') {
        *document_len = *(uint32_t *)(iter->raw + iter->d1);
        *document = iter->raw + iter->d1;
      }
      return;
    }
    pcVar2 = "document";
    uVar1 = 0x6d6;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
          ,uVar1,"bson_iter_document",pcVar2);
  abort();
}

Assistant:

void
bson_iter_document (const bson_iter_t *iter,  /* IN */
                    uint32_t *document_len,   /* OUT */
                    const uint8_t **document) /* OUT */
{
   BSON_ASSERT (iter);
   BSON_ASSERT (document_len);
   BSON_ASSERT (document);

   *document = NULL;
   *document_len = 0;

   if (ITER_TYPE (iter) == BSON_TYPE_DOCUMENT) {
      memcpy (document_len, (iter->raw + iter->d1), sizeof (*document_len));
      *document_len = BSON_UINT32_FROM_LE (*document_len);
      *document = (iter->raw + iter->d1);
   }
}